

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_test.cc
# Opt level: O2

bool __thiscall
phmap::priv::anon_unknown_0::SubstringLess::operator()(SubstringLess *this,string *a,string *b)

{
  bool bVar1;
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __y;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  basic_string_view<char,_std::char_traits<char>_> local_30;
  
  local_30._M_str = (a->_M_dataplus)._M_p;
  local_30._M_len = a->_M_string_length;
  __x = std::basic_string_view<char,_std::char_traits<char>_>::substr(&local_30,0,(long)this->n);
  local_40._M_str = (b->_M_dataplus)._M_p;
  local_40._M_len = b->_M_string_length;
  __y = std::basic_string_view<char,_std::char_traits<char>_>::substr(&local_40,0,(long)this->n);
  bVar1 = std::operator<(__x,__y);
  return bVar1;
}

Assistant:

bool operator()(const std::string &a, const std::string &b) const {
#if PHMAP_HAVE_STD_STRING_VIEW
            return std::string_view(a).substr(0, n) <
                std::string_view(b).substr(0, n);
#else
            return a.substr(0, n) < b.substr(0, n);
#endif
        }